

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O0

Curl_tree * Curl_splayinsert(curltime i,Curl_tree *t,Curl_tree *node)

{
  int iVar1;
  long lVar2;
  curltime i_00;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  Curl_tree *node_local;
  Curl_tree *t_local;
  curltime i_local;
  
  lVar2 = i.tv_sec;
  iVar1 = i.tv_usec;
  i_local._8_8_ = t;
  if (node != (Curl_tree *)0x0) {
    node_local = t;
    if (t != (Curl_tree *)0x0) {
      i_00._12_4_ = 0;
      i_00.tv_sec = SUB128(i._0_12_,0);
      i_00.tv_usec = SUB124(i._0_12_,8);
      node_local = Curl_splay(i_00,t);
      if (lVar2 < (node_local->key).tv_sec) {
        local_34 = 0xffffffff;
      }
      else {
        if ((node_local->key).tv_sec < lVar2) {
          local_38 = 1;
        }
        else {
          if (iVar1 < (node_local->key).tv_usec) {
            local_3c = 0xffffffff;
          }
          else {
            local_3c = (uint)((node_local->key).tv_usec < iVar1);
          }
          local_38 = local_3c;
        }
        local_34 = local_38;
      }
      if (local_34 == 0) {
        (node->key).tv_sec = -1;
        (node->key).tv_usec = -1;
        *(undefined4 *)&(node->key).field_0xc = 0;
        node->samen = node_local;
        node->samep = node_local->samep;
        node_local->samep->samen = node;
        node_local->samep = node;
        return node_local;
      }
    }
    if (node_local == (Curl_tree *)0x0) {
      node->larger = (Curl_tree *)0x0;
      node->smaller = (Curl_tree *)0x0;
    }
    else {
      if (lVar2 < (node_local->key).tv_sec) {
        local_40 = 0xffffffff;
      }
      else {
        if ((node_local->key).tv_sec < lVar2) {
          local_44 = 1;
        }
        else {
          if (iVar1 < (node_local->key).tv_usec) {
            local_48 = 0xffffffff;
          }
          else {
            local_48 = (uint)((node_local->key).tv_usec < iVar1);
          }
          local_44 = local_48;
        }
        local_40 = local_44;
      }
      if ((int)local_40 < 0) {
        node->smaller = node_local->smaller;
        node->larger = node_local;
        node_local->smaller = (Curl_tree *)0x0;
      }
      else {
        node->larger = node_local->larger;
        node->smaller = node_local;
        node_local->larger = (Curl_tree *)0x0;
      }
    }
    (node->key).tv_sec = lVar2;
    *(ulong *)&(node->key).tv_usec = CONCAT44(i_local.tv_sec._4_4_,iVar1);
    node->samen = node;
    node->samep = node;
    i_local._8_8_ = node;
  }
  return (Curl_tree *)i_local._8_8_;
}

Assistant:

struct Curl_tree *Curl_splayinsert(struct curltime i,
                                   struct Curl_tree *t,
                                   struct Curl_tree *node)
{
  static const struct curltime KEY_NOTUSED = {
    ~0, -1
  }; /* will *NEVER* appear */

  if(!node)
    return t;

  if(t) {
    t = Curl_splay(i, t);
    if(compare(i, t->key) == 0) {
      /* There already exists a node in the tree with the very same key. Build
         a doubly-linked circular list of nodes. We add the new 'node' struct
         to the end of this list. */

      node->key = KEY_NOTUSED; /* we set the key in the sub node to NOTUSED
                                  to quickly identify this node as a subnode */
      node->samen = t;
      node->samep = t->samep;
      t->samep->samen = node;
      t->samep = node;

      return t; /* the root node always stays the same */
    }
  }

  if(!t) {
    node->smaller = node->larger = NULL;
  }
  else if(compare(i, t->key) < 0) {
    node->smaller = t->smaller;
    node->larger = t;
    t->smaller = NULL;

  }
  else {
    node->larger = t->larger;
    node->smaller = t;
    t->larger = NULL;
  }
  node->key = i;

  /* no identical nodes (yet), we are the only one in the list of nodes */
  node->samen = node;
  node->samep = node;
  return node;
}